

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  StorageClass SVar1;
  char *pcVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  Bitset *pBVar8;
  bool local_16a;
  bool local_169;
  allocator local_109;
  undefined4 local_108;
  undefined1 local_102;
  bool local_101;
  uint32_t local_100;
  bool is_masked;
  uint32_t uStack_fc;
  bool is_tess_level;
  uint32_t local_f8;
  BuiltIn builtin;
  uint32_t local_f0;
  byte local_ea;
  bool is_builtin;
  uint32_t local_e8;
  bool is_patch_stage_in;
  bool is_stage_in;
  uint32_t local_e0;
  bool ssbo;
  char *pcStack_d8;
  bool readonly;
  char *addr_space;
  Bitset local_c8;
  uint32_t local_84;
  uint32_t local_80;
  SPIRVariable *local_70;
  SPIRVariable *var;
  Bitset flags;
  bool argument_local;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  flags.higher._M_h._M_single_bucket._3_1_ = argument;
  flags.higher._M_h._M_single_bucket._4_4_ = id;
  Bitset::Bitset((Bitset *)&var);
  local_70 = Compiler::maybe_get<spirv_cross::SPIRVariable>
                       ((Compiler *)this,flags.higher._M_h._M_single_bucket._4_4_);
  if ((local_70 == (SPIRVariable *)0x0) || (type->basetype != Struct)) {
LAB_00356fd2:
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&addr_space,
               flags.higher._M_h._M_single_bucket._4_4_);
    pBVar8 = Compiler::get_decoration_bitset((Compiler *)this,addr_space._0_4_);
    Bitset::operator=((Bitset *)&var,pBVar8);
  }
  else {
    local_80 = (type->super_IVariant).self.id;
    bVar3 = Compiler::has_decoration((Compiler *)this,(ID)local_80,Block);
    if (!bVar3) {
      local_84 = (type->super_IVariant).self.id;
      bVar3 = Compiler::has_decoration((Compiler *)this,(ID)local_84,BufferBlock);
      if (!bVar3) goto LAB_00356fd2;
    }
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&addr_space + 4),
               flags.higher._M_h._M_single_bucket._4_4_);
    Compiler::get_buffer_block_flags(&local_c8,(Compiler *)this,addr_space._4_4_);
    Bitset::operator=((Bitset *)&var,&local_c8);
    Bitset::~Bitset(&local_c8);
  }
  pcStack_d8 = (char *)0x0;
  SVar1 = type->storage;
  if (SVar1 == StorageClassUniformConstant) {
LAB_00357172:
    if (type->basetype == Struct) {
      local_e8 = (type->super_IVariant).self.id;
      is_stage_in = Compiler::has_decoration((Compiler *)this,(ID)local_e8,BufferBlock);
      if (is_stage_in) {
        bVar3 = Bitset::get((Bitset *)&var,0x18);
        pcStack_d8 = "device";
        if (bVar3) {
          pcStack_d8 = "const device";
        }
      }
      else {
        pcStack_d8 = "constant";
      }
    }
    else if ((flags.higher._M_h._M_single_bucket._3_1_ & 1) == 0) {
      pcStack_d8 = "constant";
    }
    else {
      bVar3 = type_is_msl_framebuffer_fetch(this,type);
      if (bVar3) {
        pcStack_d8 = "";
      }
    }
  }
  else if (SVar1 == Input) {
    bVar3 = is_tesc_shader(this);
    if ((bVar3) && (local_70 != (SPIRVariable *)0x0)) {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->basevariable);
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
      if ((uVar5 == uVar6) &&
         (pcStack_d8 = "threadgroup", ((this->msl_options).multi_patch_workgroup & 1U) != 0)) {
        pcStack_d8 = "const device";
      }
    }
    bVar3 = is_tese_shader(this);
    if (((bVar3) && (((this->msl_options).raw_buffer_tese_input & 1U) != 0)) &&
       (local_70 != (SPIRVariable *)0x0)) {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->basevariable);
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_ptr_var_id);
      is_builtin = uVar5 == uVar6;
      local_f0 = (local_70->super_IVariant).self.id;
      local_ea = Compiler::has_decoration((Compiler *)this,(ID)local_f0,DecorationPatch);
      local_f8 = (local_70->super_IVariant).self.id;
      builtin._3_1_ = Compiler::has_decoration((Compiler *)this,(ID)local_f8,BuiltIn);
      local_100 = (local_70->super_IVariant).self.id;
      uStack_fc = Compiler::get_decoration((Compiler *)this,(ID)local_100,BuiltIn);
      local_169 = false;
      if ((builtin._3_1_ & 1) != BuiltInPosition >> 0x18) {
        local_16a = uStack_fc == 0xb || uStack_fc == 0xc;
        local_169 = local_16a;
      }
      local_101 = local_169;
      if (((is_builtin & 1U) != 0) || (((local_ea & 1) != 0 && (local_169 == false)))) {
        pcStack_d8 = "const device";
      }
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar4 == ExecutionModelFragment) && (local_70 != (SPIRVariable *)0x0)) {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->basevariable);
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
      if (uVar5 == uVar6) {
        pcStack_d8 = "thread";
      }
    }
  }
  else {
    if (SVar1 == StorageClassUniform) goto LAB_00357172;
    if (SVar1 == Output) {
      if ((this->capture_output_to_buffer & 1U) != 0) {
        if ((local_70 != (SPIRVariable *)0x0) && (type->storage == Output)) {
          local_102 = CompilerGLSL::is_stage_output_variable_masked
                                (&this->super_CompilerGLSL,local_70);
          if ((bool)local_102) {
            bVar3 = Compiler::is_tessellation_shader((Compiler *)this);
            if (bVar3) {
              pcStack_d8 = "threadgroup";
            }
            else {
              pcStack_d8 = "thread";
            }
          }
          else {
            uVar7 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])
                              (this,local_70,4);
            if ((uVar7 & 1) != 0) {
              pcStack_d8 = "threadgroup";
            }
          }
        }
        if (pcStack_d8 == (char *)0x0) {
          pcStack_d8 = "device";
        }
      }
      bVar3 = is_mesh_shader(this);
      if (bVar3) {
        pcStack_d8 = "threadgroup";
      }
    }
    else if (SVar1 == StorageClassWorkgroup) {
      pcStack_d8 = "threadgroup";
    }
    else if (1 < SVar1 - Function) {
      if (SVar1 == PushConstant) goto LAB_00357172;
      if ((SVar1 != StorageBuffer) && (SVar1 != PhysicalStorageBuffer)) {
        if (SVar1 == StorageClassTaskPayloadWorkgroupEXT) {
          bVar3 = is_mesh_shader(this);
          if (bVar3) {
            pcStack_d8 = "const object_data";
          }
          else {
            pcStack_d8 = "object_data";
          }
        }
        goto LAB_00357683;
      }
      ssbo = false;
      if (local_70 == (SPIRVariable *)0x0) {
LAB_00357127:
        ssbo = Bitset::get((Bitset *)&var,0x18);
      }
      else {
        local_e0 = (type->super_IVariant).self.id;
        bVar3 = Compiler::has_decoration((Compiler *)this,(ID)local_e0,Block);
        if (bVar3) goto LAB_00357127;
      }
      pcStack_d8 = "device";
      if ((ssbo & 1U) != 0) {
        pcStack_d8 = "const device";
      }
    }
  }
LAB_00357683:
  if (pcStack_d8 == (char *)0x0) {
    bVar3 = true;
    if (((type->pointer & 1U) == 0) &&
       (bVar3 = false, (flags.higher._M_h._M_single_bucket._3_1_ & 1) != 0)) {
      bVar3 = type->basetype == ControlPointArray;
    }
    pcStack_d8 = "";
    if (bVar3) {
      pcStack_d8 = "thread";
    }
  }
  bVar3 = decoration_flags_signal_volatile((Bitset *)&var);
  if (bVar3) {
    uVar7 = strcmp(pcStack_d8,"thread");
    if (uVar7 != 0) {
      join<char_const(&)[10],char_const*&>
                (__return_storage_ptr__,(spirv_cross *)"volatile ",
                 (char (*) [10])&stack0xffffffffffffff28,(char **)(ulong)uVar7);
      goto LAB_003577bb;
    }
  }
  pcVar2 = pcStack_d8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_109);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
LAB_003577bb:
  local_108 = 1;
  Bitset::~Bitset((Bitset *)&var);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}

		if (is_mesh_shader())
			addr_space = "threadgroup";
		break;

	case StorageClassTaskPayloadWorkgroupEXT:
		if (is_mesh_shader())
			addr_space = "const object_data";
		else
			addr_space = "object_data";
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	if (decoration_flags_signal_volatile(flags) && 0 != strcmp(addr_space, "thread"))
		return join("volatile ", addr_space);
	else
		return addr_space;
}